

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.c
# Opt level: O3

double GetCostStat(uint litlen,uint dist,void *context)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (dist != 0) {
    uVar2 = dist - 1;
    uVar3 = 0;
    if (4 < (int)dist) {
      uVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      uVar3 = 0x1e - (uVar1 ^ 0x1f);
      uVar2 = (uint)((uVar2 >> (uVar3 & 0x1f) & 1) != 0) + (uVar1 ^ 0x1f) * 2 ^ 0x3e;
    }
    return (double)(int)(*(int *)(ZopfliGetLengthExtraBits_table + (long)(int)litlen * 4) + uVar3) +
           *(double *)
            ((long)context +
            (long)*(int *)(ZopfliGetLengthSymbol_table + (long)(int)litlen * 4) * 8 + 0xa00) +
           *(double *)((long)context + (long)(int)uVar2 * 8 + 0x1300);
  }
  return *(double *)((long)context + (ulong)litlen * 8 + 0xa00);
}

Assistant:

static double GetCostStat(unsigned litlen, unsigned dist, void* context) {
  SymbolStats* stats = (SymbolStats*)context;
  if (dist == 0) {
    return stats->ll_symbols[litlen];
  } else {
    int lsym = ZopfliGetLengthSymbol(litlen);
    int lbits = ZopfliGetLengthExtraBits(litlen);
    int dsym = ZopfliGetDistSymbol(dist);
    int dbits = ZopfliGetDistExtraBits(dist);
    return lbits + dbits + stats->ll_symbols[lsym] + stats->d_symbols[dsym];
  }
}